

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

Matrix<int> __thiscall Matrix<int>::operator+(Matrix<int> *this,Matrix<int> *M1)

{
  uint b;
  int **ppiVar1;
  int **ppiVar2;
  int i;
  long lVar3;
  int **in_RDX;
  int **ppiVar4;
  int **extraout_RDX;
  long lVar5;
  Matrix<int> MVar6;
  
  ppiVar4 = in_RDX;
  if (M1->n == *(int *)in_RDX) {
    b = M1->m;
    ppiVar4 = (int **)(ulong)b;
    if (b == *(uint *)((long)in_RDX + 4)) {
      Matrix(this,M1->n,b);
      ppiVar4 = extraout_RDX;
      for (lVar3 = 0; lVar3 < M1->n; lVar3 = lVar3 + 1) {
        ppiVar1 = M1->M;
        ppiVar4 = (int **)in_RDX[1];
        ppiVar2 = this->M;
        for (lVar5 = 0; lVar5 < M1->m; lVar5 = lVar5 + 1) {
          ppiVar2[lVar3][lVar5] = ppiVar4[lVar3][lVar5] + ppiVar1[lVar3][lVar5];
        }
      }
      goto LAB_0010a593;
    }
  }
  this->n = 0;
  this->m = 0;
  this->M = (int **)0x0;
LAB_0010a593:
  MVar6.M = ppiVar4;
  MVar6._0_8_ = this;
  return MVar6;
}

Assistant:

Matrix operator+(const Matrix& M1) const {
    if (n != M1.n || m != M1.m) {
      Matrix<T> Zero;
      return Zero;
    }
    Matrix<T> add(n, m);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        add.M[i][j] = M[i][j] + M1.M[i][j];
      }
    }
    return add;
  }